

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void print_hex(char *name,uchar *s,int slen)

{
  size_t sVar1;
  uint8_t *out;
  ulong uVar2;
  
  if (*name != '\0') {
    uVar2 = 0;
    do {
      putchar((int)name[uVar2]);
      uVar2 = uVar2 + 1;
      sVar1 = strlen(name);
    } while (uVar2 < sVar1);
  }
  out = (uint8_t *)malloc((long)(slen * 2));
  u8_to_hex(s,slen,out);
  if (0 < slen) {
    uVar2 = 0;
    do {
      putchar((uint)out[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)(slen * 2) != uVar2);
  }
  putchar(10);
  free(out);
  return;
}

Assistant:

void print_hex(const char *name, unsigned char *s, int slen)
{
    for(int i = 0; i < strlen(name); i++)
        printf("%c", name[i]);
    unsigned char *hex = (unsigned char*)malloc(2*slen);
    u8_to_hex(s, slen, hex);
    for(int i = 0; i < 2*slen; i++)
        printf("%c", hex[i]);
    printf("\n");
    free(hex);
}